

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O0

int SUNNonlinSolInitialize_FixedPoint(SUNNonlinearSolver NLS)

{
  SUNNonlinearSolver NLS_local;
  int local_4;
  
  if (NLS == (SUNNonlinearSolver)0x0) {
    local_4 = -0x385;
  }
  else if ((*NLS->content == 0) || (*(long *)((long)NLS->content + 8) == 0)) {
    local_4 = -0x385;
  }
  else {
    *(undefined8 *)((long)NLS->content + 0x98) = 0;
    *(undefined8 *)((long)NLS->content + 0xa0) = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int SUNNonlinSolInitialize_FixedPoint(SUNNonlinearSolver NLS)
{
  /* check that the nonlinear solver is non-null */
  if (NLS == NULL) return(SUN_NLS_MEM_NULL);

  /* check that all required function pointers have been set */
  if ( (FP_CONTENT(NLS)->Sys == NULL) || (FP_CONTENT(NLS)->CTest == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* reset the total number of iterations and convergence failures */
  FP_CONTENT(NLS)->niters     = 0;
  FP_CONTENT(NLS)->nconvfails = 0;

  return(SUN_NLS_SUCCESS);
}